

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  
  if (GImGui->LogEnabled == true) {
    *out_items_display_start = 0;
  }
  else {
    pIVar4 = GImGui->CurrentWindow;
    if (pIVar4->SkipItems == true) {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
      return;
    }
    fVar10 = (pIVar4->ClipRect).Min.y;
    fVar1 = (pIVar4->ClipRect).Max.y;
    bVar3 = GImGui->NavMoveRequest;
    fVar9 = fVar1;
    if (bVar3 == true) {
      fVar2 = (GImGui->NavScoringRectScreen).Min.y;
      fVar9 = (GImGui->NavScoringRectScreen).Max.y;
      if (fVar10 <= fVar2) {
        fVar2 = fVar10;
      }
      fVar10 = fVar2;
      if (fVar9 <= fVar1) {
        fVar9 = fVar1;
      }
    }
    fVar1 = (pIVar4->DC).CursorPos.y;
    iVar7 = (int)((fVar10 - fVar1) / items_height);
    if (bVar3 != false) {
      iVar7 = iVar7 - (uint)(GImGui->NavMoveClipDir == 2);
    }
    iVar8 = (int)((fVar9 - fVar1) / items_height);
    if (bVar3 != false) {
      iVar8 = iVar8 + (uint)(GImGui->NavMoveClipDir == 3);
    }
    iVar5 = items_count;
    if (iVar7 < items_count) {
      iVar5 = iVar7;
    }
    iVar6 = 0;
    if (-1 < iVar7) {
      iVar6 = iVar5;
    }
    iVar8 = iVar8 + 1;
    if (iVar8 < items_count) {
      items_count = iVar8;
    }
    if (iVar8 < iVar6) {
      items_count = iVar6;
    }
    *out_items_display_start = iVar6;
  }
  *out_items_display_end = items_count;
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (window->SkipItems)
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    // We create the union of the ClipRect and the NavScoringRect which at worst should be 1 page away from ClipRect
    ImRect unclipped_rect = window->ClipRect;
    if (g.NavMoveRequest)
        unclipped_rect.Add(g.NavScoringRectScreen);

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((unclipped_rect.Min.y - pos.y) / items_height);
    int end = (int)((unclipped_rect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}